

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event_pipe.c
# Opt level: O0

ngx_int_t ngx_event_pipe_drain_chains(ngx_event_pipe_t *p)

{
  ngx_chain_t *pnVar1;
  ngx_int_t nVar2;
  ngx_chain_t *tl;
  ngx_chain_t *cl;
  ngx_event_pipe_t *p_local;
  
  do {
    if (p->busy == (ngx_chain_t *)0x0) {
      if (p->out == (ngx_chain_t *)0x0) {
        if (p->in == (ngx_chain_t *)0x0) {
          return 0;
        }
        tl = p->in;
        p->in = (ngx_chain_t *)0x0;
      }
      else {
        tl = p->out;
        p->out = (ngx_chain_t *)0x0;
      }
    }
    else {
      tl = p->busy;
      p->busy = (ngx_chain_t *)0x0;
    }
    while (tl != (ngx_chain_t *)0x0) {
      if ((*(ushort *)&tl->buf->field_0x48 >> 9 & 1) != 0) {
        nVar2 = ngx_event_pipe_add_free_buf(p,tl->buf->shadow);
        if (nVar2 != 0) {
          return -6;
        }
        *(ushort *)&tl->buf->field_0x48 = *(ushort *)&tl->buf->field_0x48 & 0xfdff;
      }
      tl->buf->shadow = (ngx_buf_t *)0x0;
      pnVar1 = tl->next;
      tl->next = p->free;
      p->free = tl;
      tl = pnVar1;
    }
  } while( true );
}

Assistant:

static ngx_int_t
ngx_event_pipe_drain_chains(ngx_event_pipe_t *p)
{
    ngx_chain_t  *cl, *tl;

    for ( ;; ) {
        if (p->busy) {
            cl = p->busy;
            p->busy = NULL;

        } else if (p->out) {
            cl = p->out;
            p->out = NULL;

        } else if (p->in) {
            cl = p->in;
            p->in = NULL;

        } else {
            return NGX_OK;
        }

        while (cl) {
            if (cl->buf->last_shadow) {
                if (ngx_event_pipe_add_free_buf(p, cl->buf->shadow) != NGX_OK) {
                    return NGX_ABORT;
                }

                cl->buf->last_shadow = 0;
            }

            cl->buf->shadow = NULL;
            tl = cl->next;
            cl->next = p->free;
            p->free = cl;
            cl = tl;
        }
    }
}